

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

int64_t __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  byte *pbVar1;
  long lVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  uint uVar5;
  ulong uVar6;
  string *psVar7;
  string *psVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  byte *pbVar12;
  bool bVar13;
  pair<unsigned_long,_bool> pVar14;
  LogMessage aLStack_28 [16];
  
  puVar4 = this->buffer_end_;
  if (((int)puVar4 - (int)this->buffer_ < 10) &&
     ((puVar4 <= this->buffer_ || ((char)puVar4[-1] < '\0')))) {
    pVar14 = ReadVarint64Fallback(this);
    if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return -1;
    }
    return (ulong)(uint)pVar14.first;
  }
  if (first_byte_or_zero == 0) {
    psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,0,"first_byte_or_zero != 0");
  }
  else {
    psVar8 = (string *)0x0;
  }
  if (psVar8 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aLStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x206,*(undefined8 *)(psVar8 + 8),*(undefined8 *)psVar8);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (aLStack_28,
               (char (*) [64])"Caller should provide us with *buffer_ when buffer is non-empty");
LAB_002abe1f:
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)aLStack_28);
  }
  pbVar12 = this->buffer_;
  if (*pbVar12 == first_byte_or_zero) {
    psVar7 = (string *)0x0;
  }
  else {
    psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_char,long>
                       (*pbVar12,(ulong)first_byte_or_zero,"*buffer == first_byte");
  }
  if (psVar7 != (string *)0x0) {
    ReadVarint32Fallback();
    goto LAB_002abe1f;
  }
  if ((first_byte_or_zero & 0x80) == 0) {
    psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (0,0x80,"first_byte & 0x80 == 0x80");
  }
  else {
    psVar8 = (string *)0x0;
  }
  if (psVar8 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aLStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x1ae,*(undefined8 *)(psVar8 + 8),*(undefined8 *)psVar8);
    absl::lts_20240722::log_internal::LogMessage::operator<<(aLStack_28,first_byte_or_zero);
    goto LAB_002abe1f;
  }
  uVar5 = ((uint)pbVar12[1] * 0x80 + first_byte_or_zero) - 0x80;
  if ((char)pbVar12[1] < '\0') {
    uVar5 = (uVar5 + (uint)pbVar12[2] * 0x4000) - 0x4000;
    if ((char)pbVar12[2] < '\0') {
      uVar5 = (uVar5 + (uint)pbVar12[3] * 0x200000) - 0x200000;
      if ((char)pbVar12[3] < '\0') {
        uVar5 = uVar5 + (uint)pbVar12[4] * 0x10000000 + 0xf0000000;
        if ((char)pbVar12[4] < '\0') {
          pbVar1 = pbVar12 + 6;
          if ((char)pbVar12[5] < '\0') {
            pbVar12 = pbVar12 + 10;
            lVar11 = 0;
            do {
              uVar9 = (uint)lVar11;
              if (uVar9 == 4) goto LAB_002abdbd;
              lVar2 = lVar11 + 1;
              pbVar3 = pbVar1 + lVar11;
              lVar11 = lVar2;
            } while ((char)*pbVar3 < '\0');
            pbVar12 = pbVar1 + lVar2;
LAB_002abdbd:
            bVar13 = 3 < uVar9;
          }
          else {
            bVar13 = false;
            pbVar12 = pbVar1;
          }
          if (bVar13) {
            uVar10 = 0;
            bVar13 = false;
            goto LAB_002abd72;
          }
        }
        else {
          pbVar12 = pbVar12 + 5;
        }
      }
      else {
        pbVar12 = pbVar12 + 4;
      }
    }
    else {
      pbVar12 = pbVar12 + 3;
    }
  }
  else {
    pbVar12 = pbVar12 + 2;
  }
  uVar10 = (ulong)uVar5;
  bVar13 = true;
LAB_002abd72:
  uVar6 = 0xffffffffffffffff;
  if (bVar13) {
    this->buffer_ = pbVar12;
    uVar6 = uVar10;
  }
  return uVar6;
}

Assistant:

int64_t CodedInputStream::ReadVarint32Fallback(uint32_t first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32_t temp;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32_t temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64_t>(temp) : -1;
  }
}